

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  U32 UVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  ZSTD_matchState_t *pZVar7;
  U32 *pUVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  int iVar11;
  U32 UVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  U32 UVar17;
  U32 UVar18;
  uint uVar19;
  U32 UVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  size_t sVar24;
  size_t sVar25;
  bool bVar26;
  U32 local_7ac;
  U32 local_7a8;
  BYTE *local_798;
  BYTE *local_788;
  BYTE *local_750;
  BYTE *local_740;
  U32 local_734;
  U32 local_730;
  BYTE *local_720;
  BYTE *local_710;
  BYTE *local_6d8;
  BYTE *local_6c8;
  U32 local_6bc;
  U32 local_6b8;
  BYTE *local_6a8;
  BYTE *local_698;
  BYTE *local_660;
  BYTE *local_650;
  U32 local_644;
  U32 local_640;
  BYTE *local_630;
  BYTE *local_620;
  BYTE *local_5e8;
  BYTE *local_5d8;
  U32 mls;
  ZSTD_compressionParameters *cParams;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOffset_3;
  size_t repLength2_3;
  BYTE *repEnd2_3;
  BYTE *repMatch2_3;
  U32 repIndex2_3;
  U32 current2_3;
  U32 offset_9;
  U32 offset_8;
  BYTE *dictMatch_3;
  U32 dictMatchIndex_3;
  size_t dictHash_3;
  BYTE *repMatchEnd_3;
  BYTE *repMatch_3;
  BYTE *pBStack_528;
  U32 repIndex_3;
  BYTE *match_3;
  U32 matchIndex_3;
  U32 current_3;
  size_t h_3;
  size_t mLength_3;
  U32 dictHLog_3;
  U32 dictAndPrefixLength_3;
  U32 dictIndexDelta_3;
  BYTE *dictEnd_3;
  BYTE *dictStart_3;
  BYTE *dictBase_3;
  U32 dictStartIndex_3;
  U32 *dictHashTable_3;
  ZSTD_compressionParameters *dictCParams_3;
  ZSTD_matchState_t *dms_3;
  U32 local_4b8;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixStart_3;
  BYTE *pBStack_490;
  U32 prefixStartIndex_3;
  BYTE *anchor_3;
  BYTE *ip_3;
  BYTE *istart_3;
  BYTE *base_3;
  U32 stepSize_3;
  U32 hlog_3;
  U32 *hashTable_3;
  ZSTD_compressionParameters *cParams_4;
  U32 tmpOffset_2;
  size_t repLength2_2;
  BYTE *repEnd2_2;
  BYTE *repMatch2_2;
  U32 repIndex2_2;
  U32 current2_2;
  U32 offset_7;
  U32 offset_6;
  BYTE *dictMatch_2;
  U32 dictMatchIndex_2;
  size_t dictHash_2;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  BYTE *pBStack_3c8;
  U32 repIndex_2;
  BYTE *match_2;
  U32 matchIndex_2;
  U32 current_2;
  size_t h_2;
  size_t mLength_2;
  U32 dictHLog_2;
  U32 dictAndPrefixLength_2;
  U32 dictIndexDelta_2;
  BYTE *dictEnd_2;
  BYTE *dictStart_2;
  BYTE *dictBase_2;
  U32 dictStartIndex_2;
  U32 *dictHashTable_2;
  ZSTD_compressionParameters *dictCParams_2;
  ZSTD_matchState_t *dms_2;
  U32 local_358;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixStart_2;
  BYTE *pBStack_330;
  U32 prefixStartIndex_2;
  BYTE *anchor_2;
  BYTE *ip_2;
  BYTE *istart_2;
  BYTE *base_2;
  U32 stepSize_2;
  U32 hlog_2;
  U32 *hashTable_2;
  ZSTD_compressionParameters *cParams_3;
  U32 tmpOffset_1;
  size_t repLength2_1;
  BYTE *repEnd2_1;
  BYTE *repMatch2_1;
  U32 repIndex2_1;
  U32 current2_1;
  U32 offset_5;
  U32 offset_4;
  BYTE *dictMatch_1;
  U32 dictMatchIndex_1;
  size_t dictHash_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  BYTE *pBStack_268;
  U32 repIndex_1;
  BYTE *match_1;
  U32 matchIndex_1;
  U32 current_1;
  size_t h_1;
  size_t mLength_1;
  U32 dictHLog_1;
  U32 dictAndPrefixLength_1;
  U32 dictIndexDelta_1;
  BYTE *dictEnd_1;
  BYTE *dictStart_1;
  BYTE *dictBase_1;
  U32 dictStartIndex_1;
  U32 *dictHashTable_1;
  ZSTD_compressionParameters *dictCParams_1;
  ZSTD_matchState_t *dms_1;
  U32 local_1f8;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixStart_1;
  BYTE *pBStack_1d0;
  U32 prefixStartIndex_1;
  BYTE *anchor_1;
  BYTE *ip_1;
  BYTE *istart_1;
  BYTE *base_1;
  U32 stepSize_1;
  U32 hlog_1;
  U32 *hashTable_1;
  ZSTD_compressionParameters *cParams_2;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 offset_3;
  U32 offset;
  BYTE *dictMatch;
  U32 dictMatchIndex;
  size_t dictHash;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_108;
  U32 repIndex;
  BYTE *match;
  U32 matchIndex;
  U32 current;
  size_t h;
  size_t mLength;
  U32 dictHLog;
  U32 dictAndPrefixLength;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  U32 *dictHashTable;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  U32 local_98;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixStart;
  BYTE *pBStack_70;
  U32 prefixStartIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *base;
  U32 stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams_1;
  
  iVar11 = (int)src;
  switch((ms->cParams).minMatch) {
  default:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar13 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar6 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar21 = pBVar6 + uVar2;
    pBVar22 = (BYTE *)((long)src + srcSize);
    pBVar23 = pBVar22 + -8;
    offsetSaved = *rep;
    local_98 = rep[1];
    pZVar7 = ms->dictMatchState;
    pUVar8 = pZVar7->hashTable;
    uVar3 = (pZVar7->window).dictLimit;
    pBVar9 = (pZVar7->window).base;
    pBVar10 = (pZVar7->window).nextSrc;
    uVar14 = uVar2 - ((int)pBVar10 - (int)pBVar9);
    UVar4 = (pZVar7->cParams).hashLog;
    anchor = (BYTE *)((long)src +
                     (long)(int)(uint)((iVar11 - (int)pBVar21) + (int)pBVar10 ==
                                      (int)(pBVar9 + uVar3)));
    pBStack_70 = (BYTE *)src;
LAB_0011992b:
    UVar12 = offsetSaved;
    if (anchor < pBVar23) {
      sVar24 = ZSTD_hashPtr(anchor,UVar1,4);
      iVar11 = (int)pBVar6;
      uVar15 = (int)anchor - iVar11;
      uVar19 = pUVar5[sVar24];
      pBStack_108 = pBVar6 + uVar19;
      uVar16 = (uVar15 + 1) - offsetSaved;
      if (uVar16 < uVar2) {
        local_5d8 = pBVar9 + (uVar16 - uVar14);
      }
      else {
        local_5d8 = pBVar6 + uVar16;
      }
      pUVar5[sVar24] = uVar15;
      if ((uVar2 - 1) - uVar16 < 3) {
LAB_00119ae6:
        if (uVar2 < uVar19) {
          UVar17 = MEM_read32(pBStack_108);
          UVar18 = MEM_read32(anchor);
          if (UVar17 == UVar18) {
            offsetSaved = (int)anchor - (int)pBStack_108;
            sVar24 = ZSTD_count(anchor + 4,pBStack_108 + 4,pBVar22);
            h = sVar24 + 4;
            while( true ) {
              bVar26 = false;
              if (pBStack_70 < anchor && pBVar21 < pBStack_108) {
                bVar26 = anchor[-1] == pBStack_108[-1];
              }
              if (!bVar26) break;
              anchor = anchor + -1;
              pBStack_108 = pBStack_108 + -1;
              h = h + 1;
            }
            ZSTD_storeSeq(seqStore,(long)anchor - (long)pBStack_70,pBStack_70,offsetSaved + 2,h - 3)
            ;
LAB_00119e13:
            local_98 = UVar12;
            goto LAB_00119e15;
          }
          anchor = anchor + ((long)anchor - (long)pBStack_70 >> 8) + (ulong)uVar13;
        }
        else {
          sVar24 = ZSTD_hashPtr(anchor,UVar4,4);
          uVar19 = pUVar8[sVar24];
          _offset_3 = pBVar9 + uVar19;
          if (uVar3 < uVar19) {
            UVar17 = MEM_read32(_offset_3);
            UVar18 = MEM_read32(anchor);
            if (UVar17 == UVar18) {
              offsetSaved = (uVar15 - uVar19) - uVar14;
              sVar24 = ZSTD_count_2segments(anchor + 4,_offset_3 + 4,pBVar22,pBVar10,pBVar21);
              h = sVar24 + 4;
              while( true ) {
                bVar26 = false;
                if (pBStack_70 < anchor && pBVar9 + uVar3 < _offset_3) {
                  bVar26 = anchor[-1] == _offset_3[-1];
                }
                if (!bVar26) break;
                anchor = anchor + -1;
                _offset_3 = _offset_3 + -1;
                h = h + 1;
              }
              ZSTD_storeSeq(seqStore,(long)anchor - (long)pBStack_70,pBStack_70,offsetSaved + 2,
                            h - 3);
              goto LAB_00119e13;
            }
          }
          anchor = anchor + ((long)anchor - (long)pBStack_70 >> 8) + (ulong)uVar13;
        }
      }
      else {
        UVar17 = MEM_read32(local_5d8);
        UVar18 = MEM_read32(anchor + 1);
        if (UVar17 != UVar18) goto LAB_00119ae6;
        local_5e8 = pBVar22;
        if (uVar16 < uVar2) {
          local_5e8 = pBVar10;
        }
        sVar24 = ZSTD_count_2segments(anchor + 5,local_5d8 + 4,pBVar22,local_5e8,pBVar21);
        h = sVar24 + 4;
        anchor = anchor + 1;
        ZSTD_storeSeq(seqStore,(long)anchor - (long)pBStack_70,pBStack_70,0,sVar24 + 1);
LAB_00119e15:
        pBStack_70 = anchor + h;
        anchor = pBStack_70;
        if (pBStack_70 <= pBVar23) {
          sVar24 = ZSTD_hashPtr(pBVar6 + (ulong)uVar15 + 2,UVar1,4);
          pUVar5[sVar24] = uVar15 + 2;
          sVar24 = ZSTD_hashPtr(pBStack_70 + -2,UVar1,4);
          pUVar5[sVar24] = ((int)pBStack_70 + -2) - iVar11;
          for (; UVar12 = local_98, pBStack_70 = anchor, anchor <= pBVar23;
              anchor = anchor + sVar24 + 4) {
            UVar17 = (int)anchor - iVar11;
            uVar19 = UVar17 - local_98;
            if (uVar19 < uVar2) {
              local_620 = pBVar9 + ((ulong)uVar19 - (ulong)uVar14);
            }
            else {
              local_620 = pBVar6 + uVar19;
            }
            if ((uVar2 - 1) - uVar19 < 3) break;
            UVar18 = MEM_read32(local_620);
            UVar20 = MEM_read32(anchor);
            if (UVar18 != UVar20) break;
            local_630 = pBVar22;
            if (uVar19 < uVar2) {
              local_630 = pBVar10;
            }
            sVar24 = ZSTD_count_2segments(anchor + 4,local_620 + 4,pBVar22,local_630,pBVar21);
            local_98 = offsetSaved;
            offsetSaved = UVar12;
            ZSTD_storeSeq(seqStore,0,anchor,0,sVar24 + 1);
            sVar25 = ZSTD_hashPtr(anchor,UVar1,4);
            pUVar5[sVar25] = UVar17;
          }
        }
      }
      goto LAB_0011992b;
    }
    if (offsetSaved == 0) {
      local_640 = 0;
    }
    else {
      local_640 = offsetSaved;
    }
    *rep = local_640;
    if (local_98 == 0) {
      local_644 = 0;
    }
    else {
      local_644 = local_98;
    }
    rep[1] = local_644;
    ms_local = (ZSTD_matchState_t *)(pBVar22 + -(long)pBStack_70);
    break;
  case 5:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar13 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar6 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar21 = pBVar6 + uVar2;
    pBVar22 = (BYTE *)((long)src + srcSize);
    pBVar23 = pBVar22 + -8;
    offsetSaved_1 = *rep;
    local_1f8 = rep[1];
    pZVar7 = ms->dictMatchState;
    pUVar8 = pZVar7->hashTable;
    uVar3 = (pZVar7->window).dictLimit;
    pBVar9 = (pZVar7->window).base;
    pBVar10 = (pZVar7->window).nextSrc;
    uVar14 = uVar2 - ((int)pBVar10 - (int)pBVar9);
    UVar4 = (pZVar7->cParams).hashLog;
    anchor_1 = (BYTE *)((long)src +
                       (long)(int)(uint)((iVar11 - (int)pBVar21) + (int)pBVar10 ==
                                        (int)(pBVar9 + uVar3)));
    pBStack_1d0 = (BYTE *)src;
LAB_0011a373:
    UVar12 = offsetSaved_1;
    if (anchor_1 < pBVar23) {
      sVar24 = ZSTD_hashPtr(anchor_1,UVar1,5);
      iVar11 = (int)pBVar6;
      uVar15 = (int)anchor_1 - iVar11;
      uVar19 = pUVar5[sVar24];
      pBStack_268 = pBVar6 + uVar19;
      uVar16 = (uVar15 + 1) - offsetSaved_1;
      if (uVar16 < uVar2) {
        local_650 = pBVar9 + (uVar16 - uVar14);
      }
      else {
        local_650 = pBVar6 + uVar16;
      }
      pUVar5[sVar24] = uVar15;
      if ((uVar2 - 1) - uVar16 < 3) {
LAB_0011a576:
        if (uVar2 < uVar19) {
          UVar17 = MEM_read32(pBStack_268);
          UVar18 = MEM_read32(anchor_1);
          if (UVar17 == UVar18) {
            offsetSaved_1 = (int)anchor_1 - (int)pBStack_268;
            sVar24 = ZSTD_count(anchor_1 + 4,pBStack_268 + 4,pBVar22);
            h_1 = sVar24 + 4;
            while( true ) {
              bVar26 = false;
              if (pBStack_1d0 < anchor_1 && pBVar21 < pBStack_268) {
                bVar26 = anchor_1[-1] == pBStack_268[-1];
              }
              if (!bVar26) break;
              anchor_1 = anchor_1 + -1;
              pBStack_268 = pBStack_268 + -1;
              h_1 = h_1 + 1;
            }
            ZSTD_storeSeq(seqStore,(long)anchor_1 - (long)pBStack_1d0,pBStack_1d0,offsetSaved_1 + 2,
                          h_1 - 3);
LAB_0011a91b:
            local_1f8 = UVar12;
            goto LAB_0011a91d;
          }
          anchor_1 = anchor_1 + ((long)anchor_1 - (long)pBStack_1d0 >> 8) + (ulong)uVar13;
        }
        else {
          sVar24 = ZSTD_hashPtr(anchor_1,UVar4,5);
          uVar19 = pUVar8[sVar24];
          _offset_5 = pBVar9 + uVar19;
          if (uVar3 < uVar19) {
            UVar17 = MEM_read32(_offset_5);
            UVar18 = MEM_read32(anchor_1);
            if (UVar17 == UVar18) {
              offsetSaved_1 = (uVar15 - uVar19) - uVar14;
              sVar24 = ZSTD_count_2segments(anchor_1 + 4,_offset_5 + 4,pBVar22,pBVar10,pBVar21);
              h_1 = sVar24 + 4;
              while( true ) {
                bVar26 = false;
                if (pBStack_1d0 < anchor_1 && pBVar9 + uVar3 < _offset_5) {
                  bVar26 = anchor_1[-1] == _offset_5[-1];
                }
                if (!bVar26) break;
                anchor_1 = anchor_1 + -1;
                _offset_5 = _offset_5 + -1;
                h_1 = h_1 + 1;
              }
              ZSTD_storeSeq(seqStore,(long)anchor_1 - (long)pBStack_1d0,pBStack_1d0,
                            offsetSaved_1 + 2,h_1 - 3);
              goto LAB_0011a91b;
            }
          }
          anchor_1 = anchor_1 + ((long)anchor_1 - (long)pBStack_1d0 >> 8) + (ulong)uVar13;
        }
      }
      else {
        UVar17 = MEM_read32(local_650);
        UVar18 = MEM_read32(anchor_1 + 1);
        if (UVar17 != UVar18) goto LAB_0011a576;
        local_660 = pBVar22;
        if (uVar16 < uVar2) {
          local_660 = pBVar10;
        }
        sVar24 = ZSTD_count_2segments(anchor_1 + 5,local_650 + 4,pBVar22,local_660,pBVar21);
        h_1 = sVar24 + 4;
        anchor_1 = anchor_1 + 1;
        ZSTD_storeSeq(seqStore,(long)anchor_1 - (long)pBStack_1d0,pBStack_1d0,0,sVar24 + 1);
LAB_0011a91d:
        pBStack_1d0 = anchor_1 + h_1;
        anchor_1 = pBStack_1d0;
        if (pBStack_1d0 <= pBVar23) {
          sVar24 = ZSTD_hashPtr(pBVar6 + (ulong)uVar15 + 2,UVar1,5);
          pUVar5[sVar24] = uVar15 + 2;
          sVar24 = ZSTD_hashPtr(pBStack_1d0 + -2,UVar1,5);
          pUVar5[sVar24] = ((int)pBStack_1d0 + -2) - iVar11;
          for (; UVar12 = local_1f8, pBStack_1d0 = anchor_1, anchor_1 <= pBVar23;
              anchor_1 = anchor_1 + sVar24 + 4) {
            UVar17 = (int)anchor_1 - iVar11;
            uVar19 = UVar17 - local_1f8;
            if (uVar19 < uVar2) {
              local_698 = pBVar9 + ((ulong)uVar19 - (ulong)uVar14);
            }
            else {
              local_698 = pBVar6 + uVar19;
            }
            if ((uVar2 - 1) - uVar19 < 3) break;
            UVar18 = MEM_read32(local_698);
            UVar20 = MEM_read32(anchor_1);
            if (UVar18 != UVar20) break;
            local_6a8 = pBVar22;
            if (uVar19 < uVar2) {
              local_6a8 = pBVar10;
            }
            sVar24 = ZSTD_count_2segments(anchor_1 + 4,local_698 + 4,pBVar22,local_6a8,pBVar21);
            local_1f8 = offsetSaved_1;
            offsetSaved_1 = UVar12;
            ZSTD_storeSeq(seqStore,0,anchor_1,0,sVar24 + 1);
            sVar25 = ZSTD_hashPtr(anchor_1,UVar1,5);
            pUVar5[sVar25] = UVar17;
          }
        }
      }
      goto LAB_0011a373;
    }
    if (offsetSaved_1 == 0) {
      local_6b8 = 0;
    }
    else {
      local_6b8 = offsetSaved_1;
    }
    *rep = local_6b8;
    if (local_1f8 == 0) {
      local_6bc = 0;
    }
    else {
      local_6bc = local_1f8;
    }
    rep[1] = local_6bc;
    ms_local = (ZSTD_matchState_t *)(pBVar22 + -(long)pBStack_1d0);
    break;
  case 6:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar13 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar6 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar21 = pBVar6 + uVar2;
    pBVar22 = (BYTE *)((long)src + srcSize);
    pBVar23 = pBVar22 + -8;
    offsetSaved_2 = *rep;
    local_358 = rep[1];
    pZVar7 = ms->dictMatchState;
    pUVar8 = pZVar7->hashTable;
    uVar3 = (pZVar7->window).dictLimit;
    pBVar9 = (pZVar7->window).base;
    pBVar10 = (pZVar7->window).nextSrc;
    uVar14 = uVar2 - ((int)pBVar10 - (int)pBVar9);
    UVar4 = (pZVar7->cParams).hashLog;
    anchor_2 = (BYTE *)((long)src +
                       (long)(int)(uint)((iVar11 - (int)pBVar21) + (int)pBVar10 ==
                                        (int)(pBVar9 + uVar3)));
    pBStack_330 = (BYTE *)src;
LAB_0011aef6:
    UVar12 = offsetSaved_2;
    if (anchor_2 < pBVar23) {
      sVar24 = ZSTD_hashPtr(anchor_2,UVar1,6);
      iVar11 = (int)pBVar6;
      uVar15 = (int)anchor_2 - iVar11;
      uVar19 = pUVar5[sVar24];
      pBStack_3c8 = pBVar6 + uVar19;
      uVar16 = (uVar15 + 1) - offsetSaved_2;
      if (uVar16 < uVar2) {
        local_6c8 = pBVar9 + (uVar16 - uVar14);
      }
      else {
        local_6c8 = pBVar6 + uVar16;
      }
      pUVar5[sVar24] = uVar15;
      if ((uVar2 - 1) - uVar16 < 3) {
LAB_0011b0f9:
        if (uVar2 < uVar19) {
          UVar17 = MEM_read32(pBStack_3c8);
          UVar18 = MEM_read32(anchor_2);
          if (UVar17 == UVar18) {
            offsetSaved_2 = (int)anchor_2 - (int)pBStack_3c8;
            sVar24 = ZSTD_count(anchor_2 + 4,pBStack_3c8 + 4,pBVar22);
            h_2 = sVar24 + 4;
            while( true ) {
              bVar26 = false;
              if (pBStack_330 < anchor_2 && pBVar21 < pBStack_3c8) {
                bVar26 = anchor_2[-1] == pBStack_3c8[-1];
              }
              if (!bVar26) break;
              anchor_2 = anchor_2 + -1;
              pBStack_3c8 = pBStack_3c8 + -1;
              h_2 = h_2 + 1;
            }
            ZSTD_storeSeq(seqStore,(long)anchor_2 - (long)pBStack_330,pBStack_330,offsetSaved_2 + 2,
                          h_2 - 3);
LAB_0011b49e:
            local_358 = UVar12;
            goto LAB_0011b4a0;
          }
          anchor_2 = anchor_2 + ((long)anchor_2 - (long)pBStack_330 >> 8) + (ulong)uVar13;
        }
        else {
          sVar24 = ZSTD_hashPtr(anchor_2,UVar4,6);
          uVar19 = pUVar8[sVar24];
          _offset_7 = pBVar9 + uVar19;
          if (uVar3 < uVar19) {
            UVar17 = MEM_read32(_offset_7);
            UVar18 = MEM_read32(anchor_2);
            if (UVar17 == UVar18) {
              offsetSaved_2 = (uVar15 - uVar19) - uVar14;
              sVar24 = ZSTD_count_2segments(anchor_2 + 4,_offset_7 + 4,pBVar22,pBVar10,pBVar21);
              h_2 = sVar24 + 4;
              while( true ) {
                bVar26 = false;
                if (pBStack_330 < anchor_2 && pBVar9 + uVar3 < _offset_7) {
                  bVar26 = anchor_2[-1] == _offset_7[-1];
                }
                if (!bVar26) break;
                anchor_2 = anchor_2 + -1;
                _offset_7 = _offset_7 + -1;
                h_2 = h_2 + 1;
              }
              ZSTD_storeSeq(seqStore,(long)anchor_2 - (long)pBStack_330,pBStack_330,
                            offsetSaved_2 + 2,h_2 - 3);
              goto LAB_0011b49e;
            }
          }
          anchor_2 = anchor_2 + ((long)anchor_2 - (long)pBStack_330 >> 8) + (ulong)uVar13;
        }
      }
      else {
        UVar17 = MEM_read32(local_6c8);
        UVar18 = MEM_read32(anchor_2 + 1);
        if (UVar17 != UVar18) goto LAB_0011b0f9;
        local_6d8 = pBVar22;
        if (uVar16 < uVar2) {
          local_6d8 = pBVar10;
        }
        sVar24 = ZSTD_count_2segments(anchor_2 + 5,local_6c8 + 4,pBVar22,local_6d8,pBVar21);
        h_2 = sVar24 + 4;
        anchor_2 = anchor_2 + 1;
        ZSTD_storeSeq(seqStore,(long)anchor_2 - (long)pBStack_330,pBStack_330,0,sVar24 + 1);
LAB_0011b4a0:
        pBStack_330 = anchor_2 + h_2;
        anchor_2 = pBStack_330;
        if (pBStack_330 <= pBVar23) {
          sVar24 = ZSTD_hashPtr(pBVar6 + (ulong)uVar15 + 2,UVar1,6);
          pUVar5[sVar24] = uVar15 + 2;
          sVar24 = ZSTD_hashPtr(pBStack_330 + -2,UVar1,6);
          pUVar5[sVar24] = ((int)pBStack_330 + -2) - iVar11;
          for (; UVar12 = local_358, pBStack_330 = anchor_2, anchor_2 <= pBVar23;
              anchor_2 = anchor_2 + sVar24 + 4) {
            UVar17 = (int)anchor_2 - iVar11;
            uVar19 = UVar17 - local_358;
            if (uVar19 < uVar2) {
              local_710 = pBVar9 + ((ulong)uVar19 - (ulong)uVar14);
            }
            else {
              local_710 = pBVar6 + uVar19;
            }
            if ((uVar2 - 1) - uVar19 < 3) break;
            UVar18 = MEM_read32(local_710);
            UVar20 = MEM_read32(anchor_2);
            if (UVar18 != UVar20) break;
            local_720 = pBVar22;
            if (uVar19 < uVar2) {
              local_720 = pBVar10;
            }
            sVar24 = ZSTD_count_2segments(anchor_2 + 4,local_710 + 4,pBVar22,local_720,pBVar21);
            local_358 = offsetSaved_2;
            offsetSaved_2 = UVar12;
            ZSTD_storeSeq(seqStore,0,anchor_2,0,sVar24 + 1);
            sVar25 = ZSTD_hashPtr(anchor_2,UVar1,6);
            pUVar5[sVar25] = UVar17;
          }
        }
      }
      goto LAB_0011aef6;
    }
    if (offsetSaved_2 == 0) {
      local_730 = 0;
    }
    else {
      local_730 = offsetSaved_2;
    }
    *rep = local_730;
    if (local_358 == 0) {
      local_734 = 0;
    }
    else {
      local_734 = local_358;
    }
    rep[1] = local_734;
    ms_local = (ZSTD_matchState_t *)(pBVar22 + -(long)pBStack_330);
    break;
  case 7:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar13 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar6 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar21 = pBVar6 + uVar2;
    pBVar22 = (BYTE *)((long)src + srcSize);
    pBVar23 = pBVar22 + -8;
    offsetSaved_3 = *rep;
    local_4b8 = rep[1];
    pZVar7 = ms->dictMatchState;
    pUVar8 = pZVar7->hashTable;
    uVar3 = (pZVar7->window).dictLimit;
    pBVar9 = (pZVar7->window).base;
    pBVar10 = (pZVar7->window).nextSrc;
    uVar14 = uVar2 - ((int)pBVar10 - (int)pBVar9);
    UVar4 = (pZVar7->cParams).hashLog;
    anchor_3 = (BYTE *)((long)src +
                       (long)(int)(uint)((iVar11 - (int)pBVar21) + (int)pBVar10 ==
                                        (int)(pBVar9 + uVar3)));
    pBStack_490 = (BYTE *)src;
LAB_0011ba79:
    UVar12 = offsetSaved_3;
    if (anchor_3 < pBVar23) {
      sVar24 = ZSTD_hashPtr(anchor_3,UVar1,7);
      iVar11 = (int)pBVar6;
      uVar15 = (int)anchor_3 - iVar11;
      uVar19 = pUVar5[sVar24];
      pBStack_528 = pBVar6 + uVar19;
      uVar16 = (uVar15 + 1) - offsetSaved_3;
      if (uVar16 < uVar2) {
        local_740 = pBVar9 + (uVar16 - uVar14);
      }
      else {
        local_740 = pBVar6 + uVar16;
      }
      pUVar5[sVar24] = uVar15;
      if ((uVar2 - 1) - uVar16 < 3) {
LAB_0011bc7c:
        if (uVar2 < uVar19) {
          UVar17 = MEM_read32(pBStack_528);
          UVar18 = MEM_read32(anchor_3);
          if (UVar17 == UVar18) {
            offsetSaved_3 = (int)anchor_3 - (int)pBStack_528;
            sVar24 = ZSTD_count(anchor_3 + 4,pBStack_528 + 4,pBVar22);
            h_3 = sVar24 + 4;
            while( true ) {
              bVar26 = false;
              if (pBStack_490 < anchor_3 && pBVar21 < pBStack_528) {
                bVar26 = anchor_3[-1] == pBStack_528[-1];
              }
              if (!bVar26) break;
              anchor_3 = anchor_3 + -1;
              pBStack_528 = pBStack_528 + -1;
              h_3 = h_3 + 1;
            }
            ZSTD_storeSeq(seqStore,(long)anchor_3 - (long)pBStack_490,pBStack_490,offsetSaved_3 + 2,
                          h_3 - 3);
LAB_0011c021:
            local_4b8 = UVar12;
            goto LAB_0011c023;
          }
          anchor_3 = anchor_3 + ((long)anchor_3 - (long)pBStack_490 >> 8) + (ulong)uVar13;
        }
        else {
          sVar24 = ZSTD_hashPtr(anchor_3,UVar4,7);
          uVar19 = pUVar8[sVar24];
          _offset_9 = pBVar9 + uVar19;
          if (uVar3 < uVar19) {
            UVar17 = MEM_read32(_offset_9);
            UVar18 = MEM_read32(anchor_3);
            if (UVar17 == UVar18) {
              offsetSaved_3 = (uVar15 - uVar19) - uVar14;
              sVar24 = ZSTD_count_2segments(anchor_3 + 4,_offset_9 + 4,pBVar22,pBVar10,pBVar21);
              h_3 = sVar24 + 4;
              while( true ) {
                bVar26 = false;
                if (pBStack_490 < anchor_3 && pBVar9 + uVar3 < _offset_9) {
                  bVar26 = anchor_3[-1] == _offset_9[-1];
                }
                if (!bVar26) break;
                anchor_3 = anchor_3 + -1;
                _offset_9 = _offset_9 + -1;
                h_3 = h_3 + 1;
              }
              ZSTD_storeSeq(seqStore,(long)anchor_3 - (long)pBStack_490,pBStack_490,
                            offsetSaved_3 + 2,h_3 - 3);
              goto LAB_0011c021;
            }
          }
          anchor_3 = anchor_3 + ((long)anchor_3 - (long)pBStack_490 >> 8) + (ulong)uVar13;
        }
      }
      else {
        UVar17 = MEM_read32(local_740);
        UVar18 = MEM_read32(anchor_3 + 1);
        if (UVar17 != UVar18) goto LAB_0011bc7c;
        local_750 = pBVar22;
        if (uVar16 < uVar2) {
          local_750 = pBVar10;
        }
        sVar24 = ZSTD_count_2segments(anchor_3 + 5,local_740 + 4,pBVar22,local_750,pBVar21);
        h_3 = sVar24 + 4;
        anchor_3 = anchor_3 + 1;
        ZSTD_storeSeq(seqStore,(long)anchor_3 - (long)pBStack_490,pBStack_490,0,sVar24 + 1);
LAB_0011c023:
        pBStack_490 = anchor_3 + h_3;
        anchor_3 = pBStack_490;
        if (pBStack_490 <= pBVar23) {
          sVar24 = ZSTD_hashPtr(pBVar6 + (ulong)uVar15 + 2,UVar1,7);
          pUVar5[sVar24] = uVar15 + 2;
          sVar24 = ZSTD_hashPtr(pBStack_490 + -2,UVar1,7);
          pUVar5[sVar24] = ((int)pBStack_490 + -2) - iVar11;
          for (; UVar12 = local_4b8, pBStack_490 = anchor_3, anchor_3 <= pBVar23;
              anchor_3 = anchor_3 + sVar24 + 4) {
            UVar17 = (int)anchor_3 - iVar11;
            uVar19 = UVar17 - local_4b8;
            if (uVar19 < uVar2) {
              local_788 = pBVar9 + ((ulong)uVar19 - (ulong)uVar14);
            }
            else {
              local_788 = pBVar6 + uVar19;
            }
            if ((uVar2 - 1) - uVar19 < 3) break;
            UVar18 = MEM_read32(local_788);
            UVar20 = MEM_read32(anchor_3);
            if (UVar18 != UVar20) break;
            local_798 = pBVar22;
            if (uVar19 < uVar2) {
              local_798 = pBVar10;
            }
            sVar24 = ZSTD_count_2segments(anchor_3 + 4,local_788 + 4,pBVar22,local_798,pBVar21);
            local_4b8 = offsetSaved_3;
            offsetSaved_3 = UVar12;
            ZSTD_storeSeq(seqStore,0,anchor_3,0,sVar24 + 1);
            sVar25 = ZSTD_hashPtr(anchor_3,UVar1,7);
            pUVar5[sVar25] = UVar17;
          }
        }
      }
      goto LAB_0011ba79;
    }
    if (offsetSaved_3 == 0) {
      local_7a8 = 0;
    }
    else {
      local_7a8 = offsetSaved_3;
    }
    *rep = local_7a8;
    if (local_4b8 == 0) {
      local_7ac = 0;
    }
    else {
      local_7ac = local_4b8;
    }
    rep[1] = local_7ac;
    ms_local = (ZSTD_matchState_t *)(pBVar22 + -(long)pBStack_490);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}